

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::removedVec(SPxSteepPR<double> *this,int i)

{
  double *pdVar1;
  long in_RDI;
  VectorBase<double> *unaff_retaddr;
  VectorBase<double> *weights;
  int n;
  VectorBase<double> *in_stack_ffffffffffffffd0;
  VectorBase<double> *this_00;
  
  n = (int)((ulong)(*(long *)(in_RDI + 0x10) + 0x8b0) >> 0x20);
  VectorBase<double>::dim((VectorBase<double> *)0x2acf89);
  pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffffd0,n);
  this_00 = (VectorBase<double> *)*pdVar1;
  pdVar1 = VectorBase<double>::operator[](this_00,n);
  *pdVar1 = (double)this_00;
  SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2acfd1);
  VectorBase<double>::reDim
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  return;
}

Assistant:

void SPxSteepPR<R>::removedVec(int i)
{
   assert(this->thesolver != nullptr);
   VectorBase<R>& weights = this->thesolver->weights;
   weights[i] = weights[weights.dim()];
   weights.reDim(this->thesolver->coDim());
}